

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll.cpp
# Opt level: O0

Error uv11::poll_start(Poll *poll,int events,Callback *poll_cb)

{
  int iVar1;
  uv_poll_s *puVar2;
  _func_void_uv_poll_t_ptr_int_int *p_Var3;
  error_code eVar4;
  Error EVar5;
  __0 local_35;
  int local_34;
  Callback *pCStack_30;
  int s;
  Callback *poll_cb_local;
  Poll *pPStack_20;
  int events_local;
  Poll *poll_local;
  
  pCStack_30 = poll_cb;
  poll_cb_local._4_4_ = events;
  pPStack_20 = poll;
  std::function<void_(uv11::Poll_&,_std::error_code,_int)>::operator=(&poll->poll_cb,poll_cb);
  puVar2 = WrappedObject<uv_poll_s>::Get
                     (&(pPStack_20->super_HandleBase<uv_poll_s>).super_WrappedObject<uv_poll_s>);
  iVar1 = poll_cb_local._4_4_;
  p_Var3 = poll_start(uv11::Poll&,int,std::function_const&)::$_0::operator_cast_to_function_pointer
                     (&local_35);
  local_34 = uv_poll_start(puVar2,iVar1,p_Var3);
  eVar4 = make_error(local_34);
  EVar5._M_cat = eVar4._M_cat;
  EVar5._M_value = eVar4._M_value;
  EVar5._4_4_ = 0;
  return EVar5;
}

Assistant:

Error uv11::poll_start(Poll& poll, int events, Poll::Callback const& poll_cb) {
    poll.poll_cb = poll_cb;
    int s = ::uv_poll_start(&poll.Get(), events, [](uv_poll_t* ptr, int status, int ev) {
        Poll* p = reinterpret_cast<Poll*>(ptr->data);
        p->poll_cb(*p, make_error(status), ev);
    });

    return make_error(s);
}